

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O2

void __thiscall cinemo::LameWrapper::LameWrapper(LameWrapper *this,string *dir,string *file)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::__cxx11::string::string((string *)this,(string *)dir);
  std::__cxx11::string::string((string *)&this->file,(string *)file);
  std::operator+(&bStack_48,dir,"/");
  std::operator+(&this->path,&bStack_48,file);
  std::__cxx11::string::~string((string *)&bStack_48);
  (this->wh)._M_t.
  super___uniq_ptr_impl<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>._M_t.
  super__Tuple_impl<0UL,_cinemo::wh::WaveHeader_*,_std::default_delete<cinemo::wh::WaveHeader>_>.
  super__Head_base<0UL,_cinemo::wh::WaveHeader_*,_false>._M_head_impl = (WaveHeader *)0x0;
  std::__cxx11::string::string((string *)&this->message_buffer,"",(allocator *)&bStack_48);
  this->initDone = false;
  this->isBusy = false;
  this->isDone = false;
  this->quality = 3;
  return;
}

Assistant:

LameWrapper::LameWrapper(const string& dir, const string& file)
            : dir(dir), file(file), path(dir + "/" + file),
              wh(), message_buffer(""), initDone(false),
              isBusy(false), isDone(false) {
    }